

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

void __thiscall inja::Renderer::throw_renderer_error(Renderer *this,string *message,AstNode *node)

{
  RenderError *this_00;
  string_view content;
  SourceLocation location;
  
  content._M_str = (this->current_template->content)._M_dataplus._M_p;
  content._M_len = (this->current_template->content)._M_string_length;
  location = get_source_location(content,node->pos);
  this_00 = (RenderError *)__cxa_allocate_exception(0x60);
  RenderError::RenderError(this_00,message,location);
  __cxa_throw(this_00,&RenderError::typeinfo,InjaError::~InjaError);
}

Assistant:

void throw_renderer_error(const std::string& message, const AstNode& node) {
    const SourceLocation loc = get_source_location(current_template->content, node.pos);
    INJA_THROW(RenderError(message, loc));
  }